

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDisclaimer(cmLocalUnixMakefileGenerator3 *this,ostream *os)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# CMAKE generated file: DO NOT EDIT!\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Generated by \"",0x10);
  (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
    _vptr_cmGlobalGenerator[3])(&local_30);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Generator, CMake Version ",0x1a);
  cmVersion::GetMajorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  cmVersion::GetMinorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDisclaimer(std::ostream& os)
{
  os
    << "# CMAKE generated file: DO NOT EDIT!\n"
    << "# Generated by \"" << this->GlobalGenerator->GetName() << "\""
    << " Generator, CMake Version "
    << cmVersion::GetMajorVersion() << "."
    << cmVersion::GetMinorVersion() << "\n\n";
}